

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O0

bool __thiscall
wasm::EquivalentClass::hasMergeBenefit
          (EquivalentClass *this,Module *module,
          vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params)

{
  size_t sVar1;
  size_t sVar2;
  size_type sVar3;
  long lVar4;
  size_type sVar5;
  size_t positiveScore;
  size_t negativeScore;
  size_t FUNC_SEC_ENTRY_WEIGHT;
  size_t CODE_SEC_ENTRY_WEIGHT;
  size_t CODE_SEC_LOCALS_WEIGHT;
  size_t INSTR_WEIGHT;
  long local_48;
  size_t addedInstrsPerThunk;
  size_t removedInstrs;
  size_t thunkCount;
  size_type sStack_28;
  Index exprSize;
  size_t funcCount;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params_local;
  Module *module_local;
  EquivalentClass *this_local;
  
  funcCount = (size_t)params;
  params_local = (vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *)module;
  module_local = (Module *)this;
  sStack_28 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::size
                        (&this->functions);
  thunkCount._4_4_ = Measurer::measure(this->primaryFunction->body);
  sVar5 = sStack_28;
  removedInstrs = sStack_28;
  addedInstrsPerThunk = (sStack_28 - 1) * (ulong)thunkCount._4_4_;
  INSTR_WEIGHT = (size_t)Function::getParams(this->primaryFunction);
  sVar2 = wasm::Type::size((Type *)&INSTR_WEIGHT);
  sVar3 = std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>::size
                    ((vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *)funcCount);
  sVar1 = removedInstrs;
  lVar4 = sVar5 * (sVar2 + 1 + sVar3);
  local_48 = lVar4;
  sVar5 = std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>::size
                    ((vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *)funcCount);
  return lVar4 + sVar1 * (sVar5 + 2) + removedInstrs * 2 < addedInstrsPerThunk;
}

Assistant:

bool EquivalentClass::hasMergeBenefit(Module* module,
                                      const std::vector<ParamInfo>& params) {
  size_t funcCount = functions.size();
  Index exprSize = Measurer::measure(primaryFunction->body);
  size_t thunkCount = funcCount;
  // -1 for cloned primary func
  size_t removedInstrs = (funcCount - 1) * exprSize;
  // Each thunks will add local.get and call instructions to forward the params
  // and pass extra parameterized values.
  size_t addedInstrsPerThunk =
    thunkCount * (
                   // call
                   1 +
                   // local.get
                   primaryFunction->getParams().size() + params.size());

  constexpr size_t INSTR_WEIGHT = 1;
  constexpr size_t CODE_SEC_LOCALS_WEIGHT = 1;
  constexpr size_t CODE_SEC_ENTRY_WEIGHT = 2;
  constexpr size_t FUNC_SEC_ENTRY_WEIGHT = 2;

  // Glue instrs for thunks and a merged function entry will be added by the
  // merge.
  size_t negativeScore =
    addedInstrsPerThunk * INSTR_WEIGHT +
    thunkCount * (
                   // Locals entries in merged function in code section.
                   (params.size() * CODE_SEC_LOCALS_WEIGHT) +
                   // Code size field in merged function entry.
                   CODE_SEC_ENTRY_WEIGHT) +
    // Thunk function entries in function section.
    (thunkCount * FUNC_SEC_ENTRY_WEIGHT);
  size_t positiveScore = INSTR_WEIGHT * removedInstrs;
  return negativeScore < positiveScore;
}